

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellANCF_3833::PrecomputeInternalForceMatricesWeightsPreInt
          (ChElementShellANCF_3833 *this)

{
  Matrix<double,__1,__1,_0,__1,__1> *this_00;
  Matrix<double,__1,__1,_0,__1,__1> *this_01;
  double dVar1;
  double dVar2;
  double dVar3;
  pointer pLVar4;
  CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_> *pCVar5;
  Scalar *scalar;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ChElementShellANCF_3833 *this_02;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  uint t;
  long row;
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  ChMatrixNM<double,_6,_6> D;
  double GQWeight_det_J_0xi;
  ChMatrixNM<double,_3,_3> D33;
  ChMatrixNM<double,_3,_3> D22;
  ChMatrixNM<double,_3,_3> D11;
  ChMatrix33<double> J_0xi;
  ChMatrixNM<double,_9,_9> D_block;
  MatrixNxN Sxi_D_0xi_n_Sxi_D_0xi_c_transpose;
  MatrixNxN scale;
  MatrixNx3c Sxi_D_0xi;
  MatrixNx3c Sxi_D;
  ChMatrixNM<double,_6,_6> local_2f00;
  ulong local_2dd8;
  Matrix<double,__1,__1,_0,__1,__1> *local_2dd0;
  Matrix3xN *local_2dc8;
  MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *local_2dc0;
  double local_2db8;
  double local_2db0;
  ulong local_2da8;
  ulong local_2da0;
  ulong local_2d98;
  Index local_2d90;
  long local_2d88;
  double local_2d80;
  double local_2d78;
  double local_2d70;
  double local_2d68;
  double local_2d60;
  double local_2d58;
  double local_2d50;
  double local_2d48;
  double local_2d40;
  double local_2d38;
  Matrix<double,_3,_3,_1,_3,_3> local_2d30;
  Matrix<double,__1,__1,_0,__1,__1> local_2ce8;
  double local_2cd0;
  double local_2cc8;
  double local_2cc0;
  double local_2cb8;
  double local_2cb0;
  double local_2ca8;
  PlainObjectBase<Eigen::Matrix<double,24,3,0,24,3>> *local_2ca0;
  Matrix<double,__1,__1,_0,__1,__1> *pMStack_2c98;
  PlainObjectBase<Eigen::Matrix<double,24,3,0,24,3>> *pPStack_2c90;
  PlainObjectBase<Eigen::Matrix<double,24,3,0,24,3>> *pPStack_2c88;
  Matrix<double,_3,_3,_1,_3,_3> *pMStack_2c80;
  PlainObjectBase<Eigen::Matrix<double,24,3,0,24,3>> *pPStack_2c78;
  PointerType local_2c70;
  undefined8 uStack_2c68;
  XprTypeNested pMStack_2c60;
  long lStack_2c58;
  long lStack_2c50;
  Index IStack_2c48;
  undefined1 local_2c30 [16];
  scalar_constant_op<double> sStack_2c20;
  variable_if_dynamic<long,__1> vStack_2c18;
  variable_if_dynamic<long,__1> vStack_2c10;
  PlainObjectBase<Eigen::Matrix<double,24,3,0,24,3>> *pPStack_2c08;
  Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_false> local_2c00;
  PlainObjectBase<Eigen::Matrix<double,24,3,0,24,3>> local_2bd0 [72];
  Matrix<double,_9,_9,_1,_9,_9> local_2b88;
  undefined1 local_2900 [24];
  variable_if_dynamic<long,__1> vStack_28e8;
  variable_if_dynamic<long,__1> vStack_28e0;
  variable_if_dynamic<long,__1> vStack_28d8;
  PlainObjectBase<Eigen::Matrix<double,24,3,0,24,3>> *pPStack_28d0;
  RhsNested local_28c8;
  PlainObjectBase<Eigen::Matrix<double,24,3,0,24,3>> *local_28c0;
  double *local_28b8;
  PlainObjectBase<Eigen::Matrix<double,24,3,0,24,3>> *local_28b0;
  undefined1 local_1700 [8];
  ChElementShellANCF_3833 CStack_16f8;
  PlainObjectBase<Eigen::Matrix<double,24,3,0,24,3>> local_500 [576];
  PlainObjectBase<Eigen::Matrix<double,24,3,0,24,3>> local_2c0 [656];
  undefined1 extraout_var [56];
  
  this_00 = &this->m_O1;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,0x240,0x240)
  ;
  local_2dd0 = &this->m_O2;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&local_2dd0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,0x240,
             0x240);
  this_01 = &this->m_K3Compact;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&this_01->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,0x18,0x18);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&(this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,
             0x18,0x18);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->m_K13Compact);
  local_2dc0 = (MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)this_01;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this_01);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this_00);
  local_2dc8 = &this->m_ebar0;
  uVar7 = 0;
  while (uVar7 < (ulong)(long)this->m_numLayers) {
    pLVar4 = (this->m_layers).
             super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_2db0 = pLVar4[uVar7].m_thickness;
    local_2db8 = local_2db0 * 0.5 +
                 ((this->m_layer_zoffsets).
                  super__Vector_base<double,_Eigen::aligned_allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar7] - this->m_thicknessZ * 0.5) +
                 this->m_midsurfoffset;
    local_2dd8 = uVar7;
    std::__shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2> *)
               local_1700,
               (__shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2> *)
               (pLVar4 + uVar7));
    memcpy(&local_2f00,
           (PlainObjectBase<Eigen::Matrix<double,24,3,0,24,3>> *)((long)local_1700 + 0x20),0x120);
    this_02 = &CStack_16f8;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_02);
    RotateReorderStiffnessMatrix
              (this_02,&local_2f00,
               (this->m_layers).
               super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar7].m_theta);
    local_1700 = (undefined1  [8])&local_2b88;
    CStack_16f8.super_ChElementShell.super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
         = (_func_int **)0x0;
    local_2d30.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [0] = local_2f00.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[1];
    local_2ce8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)
         local_2f00.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[0];
    local_2cc8 = local_2f00.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                 m_data.array[6];
    local_2ca8 = local_2f00.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                 m_data.array[0xc];
    local_2cd0 = local_2f00.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                 m_data.array[0x1e];
    local_2ce8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
         (Index)local_2f00.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                m_data.array[0x1e];
    local_2d78 = local_2f00.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                 m_data.array[2];
    local_2cb8 = local_2f00.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                 m_data.array[0x18];
    local_2ce8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
         (Index)local_2f00.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                m_data.array[0x18];
    local_2cb0 = local_2f00.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                 m_data.array[0x12];
    local_2cc0 = local_2f00.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                 m_data.array[0x12];
    local_2d58 = local_2f00.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                 m_data.array[8];
    local_2d30.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [4] = local_2f00.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[7];
    local_2d30.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [8] = local_2f00.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0xd];
    local_2d38 = local_2f00.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                 m_data.array[0xe];
    local_2d30.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [3] = local_2f00.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x1f];
    local_2d30.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [1] = local_2f00.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x1f];
    local_2d30.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [6] = local_2f00.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x19];
    local_2d30.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [2] = local_2f00.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x19];
    local_2d60 = local_2f00.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                 m_data.array[0x20];
    local_2d70 = local_2f00.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                 m_data.array[0x20];
    local_2d30.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [7] = local_2f00.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x13];
    local_2d30.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [5] = local_2f00.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x13];
    local_2d48 = local_2f00.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                 m_data.array[0x1a];
    local_2d68 = local_2f00.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                 m_data.array[0x1a];
    local_2d40 = local_2f00.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                 m_data.array[0x14];
    local_2d50 = local_2f00.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                 m_data.array[0x14];
    CStack_16f8.super_ChElementShell.super_ChElementGeneric.Kmatr.super_ChKblock._vptr_ChKblock =
         (_func_int **)0x1;
    CStack_16f8.super_ChElementShell.super_ChElementGeneric.Kmatr.K.
    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
         (double *)0x1;
    local_2b88.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0] = local_2f00.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0];
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_> *)local_1700,
                        local_2f00.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                        m_storage.m_data.array + 5);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 4);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 5);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 1);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 3);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 4);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 3);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 2);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x1e);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x23);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x22);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x23);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x1f);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x21);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x22);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x21);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x20);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x18);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x1d);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x1c);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x1d);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x19);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x1b);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x1c);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x1b);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x1a);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x1e);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x23);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x22);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x23);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x1f);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x21);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x22);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x21);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x20);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 6);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0xb);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 10);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0xb);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 7);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 9);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 10);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 9);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 8);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x12);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x17);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x16);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x17);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x13);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x15);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x16);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x15);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x14);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x18);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x1d);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x1c);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x1d);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x19);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x1b);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x1c);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x1b);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x1a);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x12);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x17);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x16);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x17);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x13);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x15);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x16);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x15);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x14);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0xc);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x11);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x10);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x11);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0xd);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0xf);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x10);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                       (pCVar5,local_2f00.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0xf);
    Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
              (pCVar5,local_2f00.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                      m_storage.m_data.array + 0xe);
    Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::finished
              ((CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_> *)local_1700);
    lVar12 = *(long *)(DAT_011df610 + 0x30);
    lVar6 = *(long *)(DAT_011df610 + 0x38);
    uVar9 = 0;
    lVar8 = DAT_011df610;
    while (uVar7 = (ulong)uVar9, uVar7 < (ulong)(lVar6 - lVar12 >> 3)) {
      uVar9 = 0;
      local_2da8 = uVar7;
      while ((ulong)uVar9 < (ulong)(lVar6 - lVar12 >> 3)) {
        uVar10 = 0;
        local_2da0 = (ulong)uVar9;
        while( true ) {
          uVar11 = (ulong)uVar10;
          if ((ulong)(*(long *)(lVar8 + 0x20) - *(long *)(lVar8 + 0x18) >> 3) <= uVar11) break;
          dVar1 = *(double *)(*(long *)(static_tables_3833 + 0x30) + uVar7 * 8);
          dVar2 = *(double *)(*(long *)(static_tables_3833 + 0x30) + local_2da0 * 8);
          dVar3 = *(double *)(*(long *)(static_tables_3833 + 0x18) + uVar11 * 8);
          local_2d98 = uVar11;
          Calc_Sxi_D(this,(MatrixNx3c *)local_2c0,*(double *)(*(long *)(lVar8 + 0x30) + uVar7 * 8),
                     *(double *)(*(long *)(lVar8 + 0x30) + local_2da0 * 8),
                     *(double *)(*(long *)(lVar8 + 0x18) + uVar11 * 8),local_2db0,local_2db8);
          local_1700 = (undefined1  [8])local_2dc8;
          local_2900._0_8_ = local_2bd0;
          CStack_16f8.super_ChElementShell.super_ChElementGeneric.super_ChElementBase.
          _vptr_ChElementBase = (_func_int **)local_2c0;
          Eigen::NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase>::operator=
                    ((NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase> *)local_2900,
                     (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_Eigen::Matrix<double,_24,_3,_0,_24,_3>,_0>_>
                      *)local_1700);
          local_1700 = (undefined1  [8])local_2c0;
          CStack_16f8.super_ChElementShell.super_ChElementGeneric.super_ChElementBase.
          _vptr_ChElementBase = (_func_int **)local_2bd0;
          Eigen::PlainObjectBase<Eigen::Matrix<double,24,3,0,24,3>>::
          _set_noalias<Eigen::Product<Eigen::Matrix<double,24,3,0,24,3>,Eigen::Inverse<Eigen::Matrix<double,3,3,1,3,3>>,0>>
                    (local_500,
                     (DenseBase<Eigen::Product<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_0>_>
                      *)local_1700);
          auVar14._0_8_ =
               Eigen::internal::determinant_impl<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3>::run
                         ((Matrix<double,_3,_3,_1,_3,_3> *)local_2bd0);
          auVar14._8_56_ = extraout_var;
          auVar13._8_8_ = 0x8000000000000000;
          auVar13._0_8_ = 0x8000000000000000;
          auVar13 = vxorpd_avx512vl(auVar14._0_16_,auVar13);
          local_2900._16_8_ = &local_2ce8;
          local_2d80 = auVar13._0_8_ * dVar1 * dVar2 * dVar3;
          vStack_28d8.m_value = (long)&local_2d30;
          local_28b8 = &local_2d78;
          local_2ca0 = (PlainObjectBase<Eigen::Matrix<double,24,3,0,24,3>> *)(local_2d80 * 0.5);
          local_2900._8_8_ = local_500;
          vStack_28e8.m_value = (long)local_500;
          vStack_28e0.m_value = (long)local_500;
          pPStack_28d0 = local_500;
          local_28c0 = local_500;
          local_28b0 = local_500;
          Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_24,_3,_0,_24,_3>_>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_24,_3,_0,_24,_3>_>,_0>_>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_24,_3,_0,_24,_3>_>,_0>_>_>
                            *)local_1700,(double *)&local_2ca0,(StorageBaseType *)local_2900);
          Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator+=
                    (local_2dc0,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_24,_3,_0,_24,_3>_>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_24,_3,_0,_24,_3>_>,_0>_>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_24,_3,_0,_24,_3>_>,_0>_>_>_>
                      *)local_1700);
          for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
            local_2d90 = lVar12 * 3;
            lVar6 = 0;
            while (lVar6 != 3) {
              Eigen::Block<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false>::Block
                        ((Block<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false> *)&local_2ca0,
                         &local_2b88,local_2d90,lVar6 * 3);
              vStack_28d8.m_value = (long)pMStack_2c80;
              pPStack_28d0 = pPStack_2c78;
              local_2900._8_8_ = local_2ca0;
              local_2900._16_8_ = pMStack_2c98;
              vStack_28e8.m_value = (long)pPStack_2c90;
              vStack_28e0.m_value = (long)pPStack_2c88;
              local_2900._0_8_ = local_500;
              local_28c8.m_matrix = (non_const_type)local_500;
              Eigen::internal::
              call_assignment<Eigen::Matrix<double,24,24,1,24,24>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,24,3,0,24,3>,Eigen::Block<Eigen::Matrix<double,9,9,1,9,9>,3,3,false>,0>,Eigen::Transpose<Eigen::Matrix<double,24,3,0,24,3>>,0>>
                        ((Matrix<double,_24,_24,_1,_24,_24> *)local_1700,
                         (Product<Eigen::Product<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_Eigen::Block<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_24,_3,_0,_24,_3>_>,_0>
                          *)local_2900);
              Eigen::DenseBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>::operator*=
                        ((DenseBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_> *)local_1700,
                         &local_2d80);
              Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_false>::Block
                        ((Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_false> *)local_2c30,
                         (Matrix<double,_24,_3,_0,_24,_3> *)local_500,0,lVar12);
              local_2d88 = lVar6;
              Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_false>::Block
                        (&local_2c00,(Matrix<double,_24,_3,_0,_24,_3> *)local_500,0,lVar6);
              lStack_2c50 = local_2c00.
                            super_BlockImpl<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_false,_Eigen::Dense>
                            .
                            super_BlockImpl_dense<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_false,_true>
                            .m_startCol.m_value;
              IStack_2c48 = local_2c00.
                            super_BlockImpl<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_false,_Eigen::Dense>
                            .
                            super_BlockImpl_dense<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_false,_true>
                            .m_outerStride;
              local_2c70 = local_2c00.
                           super_BlockImpl<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_false,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_false,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_false>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_false>,_0>
                           .m_data;
              uStack_2c68 = local_2c00.
                            super_BlockImpl<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_false,_Eigen::Dense>
                            .
                            super_BlockImpl_dense<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_false,_true>
                            .
                            super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_false>,_1>
                            .
                            super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_false>,_0>
                            ._8_8_;
              pMStack_2c60 = local_2c00.
                             super_BlockImpl<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_false,_Eigen::Dense>
                             .
                             super_BlockImpl_dense<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_false,_true>
                             .m_xpr;
              lStack_2c58 = local_2c00.
                            super_BlockImpl<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_false,_Eigen::Dense>
                            .
                            super_BlockImpl_dense<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_false,_true>
                            .m_startRow.m_value;
              local_2ca0 = (PlainObjectBase<Eigen::Matrix<double,24,3,0,24,3>> *)local_2c30._0_8_;
              pMStack_2c98 = (Matrix<double,__1,__1,_0,__1,__1> *)local_2c30._8_8_;
              pPStack_2c90 = (PlainObjectBase<Eigen::Matrix<double,24,3,0,24,3>> *)
                             sStack_2c20.m_other;
              pPStack_2c88 = (PlainObjectBase<Eigen::Matrix<double,24,3,0,24,3>> *)
                             vStack_2c18.m_value;
              pMStack_2c80 = (Matrix<double,_3,_3,_1,_3,_3> *)vStack_2c10.m_value;
              pPStack_2c78 = pPStack_2c08;
              Eigen::PlainObjectBase<Eigen::Matrix<double,24,24,1,24,24>>::
              _set_noalias<Eigen::Product<Eigen::Block<Eigen::Matrix<double,24,3,0,24,3>,24,1,false>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,24,3,0,24,3>,24,1,false>>,0>>
                        ((PlainObjectBase<Eigen::Matrix<double,24,24,1,24,24>> *)local_2900,
                         (DenseBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_false>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_false>_>,_0>_>
                          *)&local_2ca0);
              for (lVar6 = 0; lVar6 != 0x18; lVar6 = lVar6 + 1) {
                lVar8 = 0;
                for (row = 0; row != 0x18; row = row + 1) {
                  scalar = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>,_1>::
                           operator()((DenseCoeffsBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>,_1>
                                       *)local_1700,row,lVar6);
                  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                    *)local_2c30,scalar,(StorageBaseType *)local_2900);
                  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_24,_24,_false>::Block
                            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_24,_24,_false> *)
                             &local_2ca0,this_00,lVar8,lVar6 * 0x18);
                  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,24,24,false>>::
                  operator+=((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,24,24,false>>
                              *)&local_2ca0,
                             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>
                              *)local_2c30);
                  lVar8 = lVar8 + 0x18;
                }
              }
              lVar6 = local_2d88 + 1;
            }
          }
          uVar10 = (int)local_2d98 + 1;
          lVar8 = DAT_011df610;
          uVar7 = local_2da8;
        }
        lVar12 = *(long *)(lVar8 + 0x30);
        lVar6 = *(long *)(lVar8 + 0x38);
        uVar9 = (int)local_2da0 + 1;
      }
      uVar9 = (int)uVar7 + 1;
    }
    uVar7 = local_2dd8 + 1;
  }
  for (lVar12 = 0; lVar12 != 0x18; lVar12 = lVar12 + 1) {
    for (lVar6 = 0; lVar6 != 0x240; lVar6 = lVar6 + 0x18) {
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_24,_24,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_24,_24,_false> *)local_2900,
                 this_00,lVar6,lVar12 * 0x18);
      CStack_16f8.super_ChElementShell.super_ChElementGeneric.Kmatr.K.
      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows =
           vStack_28e0.m_value;
      CStack_16f8.super_ChElementShell.super_ChElementGeneric.Kmatr.K.
      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols =
           vStack_28d8.m_value;
      local_1700 = (undefined1  [8])local_2900._0_8_;
      CStack_16f8.super_ChElementShell.super_ChElementGeneric.super_ChElementBase.
      _vptr_ChElementBase = (_func_int **)local_2900._8_8_;
      CStack_16f8.super_ChElementShell.super_ChElementGeneric.Kmatr.super_ChKblock._vptr_ChKblock =
           (_func_int **)local_2900._16_8_;
      CStack_16f8.super_ChElementShell.super_ChElementGeneric.Kmatr.K.
      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
           (double *)vStack_28e8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_24,_24,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_24,_24,_false> *)&local_2b88,
                 local_2dd0,lVar6,lVar12 * 0x18);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,24,24,false>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,24,24,false>>>
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_24,_24,_false> *)&local_2b88,
                 (Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_24,_24,_false>_>
                  *)local_1700);
    }
  }
  return;
}

Assistant:

void ChElementShellANCF_3833::PrecomputeInternalForceMatricesWeightsPreInt() {
    ChQuadratureTables* GQTable = GetStaticGQTables();
    unsigned int GQ_idx_xi_eta = NP - 1;  // Gauss-Quadrature table index for xi and eta
    unsigned int GQ_idx_zeta = NT - 1;    // Gauss-Quadrature table index for zeta

    m_O1.resize(NSF * NSF, NSF * NSF);
    m_O2.resize(NSF * NSF, NSF * NSF);
    m_K3Compact.resize(NSF, NSF);
    m_K13Compact.resize(NSF, NSF);

    m_K13Compact.setZero();
    m_K3Compact.setZero();
    m_O1.setZero();

    for (size_t kl = 0; kl < m_numLayers; kl++) {
        double thickness = m_layers[kl].Get_thickness();
        double layer_midsurface_offset =
            -m_thicknessZ / 2 + m_layer_zoffsets[kl] + m_layers[kl].Get_thickness() / 2 + m_midsurfoffset;

        // =============================================================================
        // Get the stiffness tensor in 6x6 matrix form for the current layer and rotate it in the midsurface according
        // to the user specified angle.  Note that the matrix is reordered as well to match the Voigt notation used in
        // this element compared to what is used in ChMaterialShellANCF
        // =============================================================================

        ChMatrixNM<double, 6, 6> D = m_layers[kl].GetMaterial()->Get_E_eps();
        RotateReorderStiffnessMatrix(D, m_layers[kl].Get_theta());

        // =============================================================================
        // Pull the required entries from the 4th order stiffness tensor that are needed for K3.  Note that D is written
        // in Voigt notation rather than a 4th other tensor so the correct entries from that matrix need to be pulled.
        // D11 = slice (matrix) of the 4th order tensor with last two subscripts = 1)
        // D22 = slice (matrix) of the 4th order tensor with last two subscripts = 2)
        // D33 = slice (matrix) of the 4th order tensor with last two subscripts = 3)
        // =============================================================================
        ChMatrixNM<double, 3, 3> D11;
        ChMatrixNM<double, 3, 3> D22;
        ChMatrixNM<double, 3, 3> D33;
        D11(0, 0) = D(0, 0);
        D11(1, 1) = D(1, 0);
        D11(2, 2) = D(2, 0);
        D11(1, 0) = D(5, 0);
        D11(0, 1) = D(5, 0);
        D11(2, 0) = D(4, 0);
        D11(0, 2) = D(4, 0);
        D11(2, 1) = D(3, 0);
        D11(1, 2) = D(3, 0);

        D22(0, 0) = D(0, 1);
        D22(1, 1) = D(1, 1);
        D22(2, 2) = D(2, 1);
        D22(1, 0) = D(5, 1);
        D22(0, 1) = D(5, 1);
        D22(2, 0) = D(4, 1);
        D22(0, 2) = D(4, 1);
        D22(2, 1) = D(3, 1);
        D22(1, 2) = D(3, 1);

        D33(0, 0) = D(0, 2);
        D33(1, 1) = D(1, 2);
        D33(2, 2) = D(2, 2);
        D33(1, 0) = D(5, 2);
        D33(0, 1) = D(5, 2);
        D33(2, 0) = D(4, 2);
        D33(0, 2) = D(4, 2);
        D33(2, 1) = D(3, 2);
        D33(1, 2) = D(3, 2);

        // Setup the stiffness tensor in block matrix form to make it easier to iterate through all 4 subscripts
        ChMatrixNM<double, 9, 9> D_block;
        D_block << D(0, 0), D(0, 5), D(0, 4), D(0, 5), D(0, 1), D(0, 3), D(0, 4), D(0, 3), D(0, 2), D(5, 0), D(5, 5),
            D(5, 4), D(5, 5), D(5, 1), D(5, 3), D(5, 4), D(5, 3), D(5, 2), D(4, 0), D(4, 5), D(4, 4), D(4, 5), D(4, 1),
            D(4, 3), D(4, 4), D(4, 3), D(4, 2), D(5, 0), D(5, 5), D(5, 4), D(5, 5), D(5, 1), D(5, 3), D(5, 4), D(5, 3),
            D(5, 2), D(1, 0), D(1, 5), D(1, 4), D(1, 5), D(1, 1), D(1, 3), D(1, 4), D(1, 3), D(1, 2), D(3, 0), D(3, 5),
            D(3, 4), D(3, 5), D(3, 1), D(3, 3), D(3, 4), D(3, 3), D(3, 2), D(4, 0), D(4, 5), D(4, 4), D(4, 5), D(4, 1),
            D(4, 3), D(4, 4), D(4, 3), D(4, 2), D(3, 0), D(3, 5), D(3, 4), D(3, 5), D(3, 1), D(3, 3), D(3, 4), D(3, 3),
            D(3, 2), D(2, 0), D(2, 5), D(2, 4), D(2, 5), D(2, 1), D(2, 3), D(2, 4), D(2, 3), D(2, 2);

        // Loop over each Gauss quadrature point and sum the contribution to each constant matrix that will be used for
        // the internal force calculations
        for (unsigned int it_xi = 0; it_xi < GQTable->Lroots[GQ_idx_xi_eta].size(); it_xi++) {
            for (unsigned int it_eta = 0; it_eta < GQTable->Lroots[GQ_idx_xi_eta].size(); it_eta++) {
                for (unsigned int it_zeta = 0; it_zeta < GQTable->Lroots[GQ_idx_zeta].size(); it_zeta++) {
                    double GQ_weight = GQTable->Weight[GQ_idx_xi_eta][it_xi] * GQTable->Weight[GQ_idx_xi_eta][it_eta] *
                                       GQTable->Weight[GQ_idx_zeta][it_zeta];
                    double xi = GQTable->Lroots[GQ_idx_xi_eta][it_xi];
                    double eta = GQTable->Lroots[GQ_idx_xi_eta][it_eta];
                    double zeta = GQTable->Lroots[GQ_idx_zeta][it_zeta];

                    ChMatrix33<double>
                        J_0xi;  // Element Jacobian between the reference configuration and normalized configuration
                    MatrixNx3c Sxi_D;  // Matrix of normalized shape function derivatives

                    Calc_Sxi_D(Sxi_D, xi, eta, zeta, thickness, layer_midsurface_offset);
                    J_0xi.noalias() = m_ebar0 * Sxi_D;

                    MatrixNx3c Sxi_D_0xi = Sxi_D * J_0xi.inverse();
                    double GQWeight_det_J_0xi = -J_0xi.determinant() * GQ_weight;

                    m_K3Compact += GQWeight_det_J_0xi * 0.5 *
                                   (Sxi_D_0xi * D11 * Sxi_D_0xi.transpose() + Sxi_D_0xi * D22 * Sxi_D_0xi.transpose() +
                                    Sxi_D_0xi * D33 * Sxi_D_0xi.transpose());

                    MatrixNxN scale;
                    for (unsigned int n = 0; n < 3; n++) {
                        for (unsigned int c = 0; c < 3; c++) {
                            scale = Sxi_D_0xi * D_block.block<3, 3>(3 * n, 3 * c) * Sxi_D_0xi.transpose();
                            scale *= GQWeight_det_J_0xi;

                            MatrixNxN Sxi_D_0xi_n_Sxi_D_0xi_c_transpose =
                                Sxi_D_0xi.template block<NSF, 1>(0, n) *
                                Sxi_D_0xi.template block<NSF, 1>(0, c).transpose();
                            for (unsigned int f = 0; f < NSF; f++) {
                                for (unsigned int t = 0; t < NSF; t++) {
                                    m_O1.block<NSF, NSF>(NSF * t, NSF * f) +=
                                        scale(t, f) * Sxi_D_0xi_n_Sxi_D_0xi_c_transpose;
                                }
                            }
                        }
                    }
                }
            }
        }
    }

    // Since O2 is just a reordered version of O1, wait until O1 is completely calculated and then generate O2 from it
    for (unsigned int f = 0; f < NSF; f++) {
        for (unsigned int t = 0; t < NSF; t++) {
            m_O2.block<NSF, NSF>(NSF * t, NSF * f) = m_O1.block<NSF, NSF>(NSF * t, NSF * f).transpose();
        }
    }
}